

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib502.c
# Opt level: O0

int test(char *URL)

{
  undefined8 uVar1;
  int iVar2;
  undefined8 uVar3;
  long lVar4;
  int *piVar5;
  char *pcVar6;
  timeval tVar7;
  timeval older;
  timeval older_00;
  int ec_5;
  CURLMcode ec_4;
  fd_set *__arr_2;
  uint __i_2;
  fd_set *__arr_1;
  uint __i_1;
  fd_set *__arr;
  uint __i;
  int local_1e4;
  CURLMcode ec_3;
  int maxfd;
  fd_set fdexcep;
  fd_set fdwrite;
  fd_set fdread;
  timeval timeout;
  CURLMcode ec_2;
  CURLcode ec_1;
  CURLcode ec;
  __suseconds_t local_38;
  int local_30;
  int local_2c;
  int running;
  int res;
  CURLM *m;
  CURL *c;
  char *URL_local;
  
  m = (CURLM *)0x0;
  _running = 0;
  local_2c = 0;
  c = (CURL *)URL;
  tVar7 = tutil_tvnow();
  _ec_1 = tVar7.tv_sec;
  tv_test_start.tv_sec = _ec_1;
  local_38 = tVar7.tv_usec;
  tv_test_start.tv_usec = local_38;
  iVar2 = curl_global_init(3);
  uVar1 = _stderr;
  if (iVar2 != 0) {
    uVar3 = curl_easy_strerror(iVar2);
    curl_mfprintf(uVar1,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/DarovskikhAndrei[P]curl/tests/libtest/lib502.c"
                  ,0x2b,iVar2,uVar3);
    local_2c = iVar2;
  }
  if (local_2c == 0) {
    m = (CURLM *)curl_easy_init();
    if (m == (CURLM *)0x0) {
      curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/DarovskikhAndrei[P]curl/tests/libtest/lib502.c"
                    ,0x2d);
      local_2c = 0x7c;
    }
    if (local_2c == 0) {
      iVar2 = curl_easy_setopt(m,0x2712,c);
      uVar1 = _stderr;
      if (iVar2 != 0) {
        uVar3 = curl_easy_strerror(iVar2);
        curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/DarovskikhAndrei[P]curl/tests/libtest/lib502.c"
                      ,0x2f,iVar2,uVar3);
        local_2c = iVar2;
      }
      if (local_2c == 0) {
        _running = curl_multi_init();
        if (_running == 0) {
          curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/DarovskikhAndrei[P]curl/tests/libtest/lib502.c"
                        ,0x31);
          local_2c = 0x7b;
        }
        if (local_2c == 0) {
          iVar2 = curl_multi_add_handle(_running,m);
          uVar1 = _stderr;
          if (iVar2 != 0) {
            uVar3 = curl_multi_strerror(iVar2);
            curl_mfprintf(uVar1,"%s:%d curl_multi_add_handle() failed, with code %d (%s)\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/DarovskikhAndrei[P]curl/tests/libtest/lib502.c"
                          ,0x33,iVar2,uVar3);
            local_2c = iVar2;
          }
          if (local_2c == 0) {
            while( true ) {
              local_1e4 = -99;
              fdread.__fds_bits[0xf] = 0;
              iVar2 = curl_multi_perform(_running,&local_30);
              uVar1 = _stderr;
              if (iVar2 == 0) {
                if (local_30 < 0) {
                  curl_mfprintf(_stderr,
                                "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/DarovskikhAndrei[P]curl/tests/libtest/lib502.c"
                                ,0x3d,local_30);
                  local_2c = 0x7a;
                }
              }
              else {
                uVar3 = curl_multi_strerror(iVar2);
                curl_mfprintf(uVar1,"%s:%d curl_multi_perform() failed, with code %d (%s)\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/DarovskikhAndrei[P]curl/tests/libtest/lib502.c"
                              ,0x3d,iVar2,uVar3);
                local_2c = iVar2;
              }
              if (local_2c != 0) break;
              tVar7 = tutil_tvnow();
              older.tv_usec = tv_test_start.tv_usec;
              older.tv_sec = tv_test_start.tv_sec;
              lVar4 = tutil_tvdiff(tVar7,older);
              if (60000 < lVar4) {
                curl_mfprintf(_stderr,
                              "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/DarovskikhAndrei[P]curl/tests/libtest/lib502.c"
                              ,0x3f);
                local_2c = 0x7d;
              }
              if ((local_2c != 0) || (local_30 == 0)) break;
              for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
                fdwrite.__fds_bits[(ulong)__arr._4_4_ + 0xf] = 0;
              }
              for (__arr_1._4_4_ = 0; __arr_1._4_4_ < 0x10; __arr_1._4_4_ = __arr_1._4_4_ + 1) {
                fdexcep.__fds_bits[(ulong)__arr_1._4_4_ + 0xf] = 0;
              }
              for (__arr_2._4_4_ = 0; __arr_2._4_4_ < 0x10; __arr_2._4_4_ = __arr_2._4_4_ + 1) {
                (&ec_3 + (ulong)__arr_2._4_4_ * 2)[0] = CURLM_OK;
                (&ec_3 + (ulong)__arr_2._4_4_ * 2)[1] = CURLM_OK;
              }
              iVar2 = curl_multi_fdset(_running,fdwrite.__fds_bits + 0xf,fdexcep.__fds_bits + 0xf,
                                       &ec_3,&local_1e4);
              uVar1 = _stderr;
              if (iVar2 == 0) {
                if (local_1e4 < -1) {
                  curl_mfprintf(_stderr,
                                "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/DarovskikhAndrei[P]curl/tests/libtest/lib502.c"
                                ,0x48,local_1e4);
                  local_2c = 0x7a;
                }
              }
              else {
                uVar3 = curl_multi_strerror(iVar2);
                curl_mfprintf(uVar1,"%s:%d curl_multi_fdset() failed, with code %d (%s)\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/DarovskikhAndrei[P]curl/tests/libtest/lib502.c"
                              ,0x48,iVar2,uVar3);
                local_2c = iVar2;
              }
              if (local_2c != 0) break;
              iVar2 = select_wrapper(local_1e4 + 1,(fd_set *)(fdwrite.__fds_bits + 0xf),
                                     (fd_set *)(fdexcep.__fds_bits + 0xf),(fd_set *)&ec_3,
                                     (timeval *)(fdread.__fds_bits + 0xf));
              if (iVar2 == -1) {
                piVar5 = __errno_location();
                uVar1 = _stderr;
                iVar2 = *piVar5;
                pcVar6 = strerror(iVar2);
                curl_mfprintf(uVar1,"%s:%d select() failed, with errno %d (%s)\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/DarovskikhAndrei[P]curl/tests/libtest/lib502.c"
                              ,0x4c,iVar2,pcVar6);
                local_2c = 0x79;
              }
              if (local_2c != 0) break;
              tVar7 = tutil_tvnow();
              older_00.tv_usec = tv_test_start.tv_usec;
              older_00.tv_sec = tv_test_start.tv_sec;
              lVar4 = tutil_tvdiff(tVar7,older_00);
              if (60000 < lVar4) {
                curl_mfprintf(_stderr,
                              "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/DarovskikhAndrei[P]curl/tests/libtest/lib502.c"
                              ,0x4e);
                local_2c = 0x7d;
              }
              if (local_2c != 0) break;
            }
          }
        }
      }
    }
    curl_multi_remove_handle(_running,m);
    curl_multi_cleanup(_running);
    curl_easy_cleanup(m);
    curl_global_cleanup();
    URL_local._4_4_ = local_2c;
  }
  else {
    URL_local._4_4_ = local_2c;
  }
  return URL_local._4_4_;
}

Assistant:

int test(char *URL)
{
  CURL *c = NULL;
  CURLM *m = NULL;
  int res = 0;
  int running;

  start_test_timing();

  global_init(CURL_GLOBAL_ALL);

  easy_init(c);

  easy_setopt(c, CURLOPT_URL, URL);

  multi_init(m);

  multi_add_handle(m, c);

  for(;;) {
    struct timeval timeout;
    fd_set fdread, fdwrite, fdexcep;
    int maxfd = -99;

    timeout.tv_sec = 0;
    timeout.tv_usec = 100000L; /* 100 ms */

    multi_perform(m, &running);

    abort_on_test_timeout();

    if(!running)
      break; /* done */

    FD_ZERO(&fdread);
    FD_ZERO(&fdwrite);
    FD_ZERO(&fdexcep);

    multi_fdset(m, &fdread, &fdwrite, &fdexcep, &maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    select_test(maxfd + 1, &fdread, &fdwrite, &fdexcep, &timeout);

    abort_on_test_timeout();
  }

test_cleanup:

  /* proper cleanup sequence - type PA */

  curl_multi_remove_handle(m, c);
  curl_multi_cleanup(m);
  curl_easy_cleanup(c);
  curl_global_cleanup();

  return res;
}